

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controlparser.cpp
# Opt level: O0

void __thiscall ControlParser::ControlParser(ControlParser *this)

{
  ControlParser *this_local;
  
  std::__cxx11::istringstream::istringstream((istringstream *)this);
  initializeControlSettings(this);
  return;
}

Assistant:

ControlParser::ControlParser()
{
    initializeControlSettings();
}